

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

int Extra_TruthMinCofSuppOverlap(uint *pTruth,int nVars,int *pVarMin)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar;
  
  if (9 < nVars) {
    __assert_fail("nVars <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilTruth.c"
                  ,0x30d,"int Extra_TruthMinCofSuppOverlap(unsigned int *, int, int *)");
  }
  if (nVars < 1) {
    uVar8 = 0x20;
    iVar4 = -1;
  }
  else {
    uVar1 = 1 << ((char)nVars - 5U & 0x1f);
    if (nVars < 6) {
      uVar1 = 1;
    }
    iVar4 = -1;
    uVar8 = 0x20;
    iVar = 0;
    do {
      lVar3 = (ulong)uVar1 + 1;
      if (0 < (int)uVar1) {
        do {
          Extra_TruthVarsAntiSymm::uTemp1[lVar3 + 0xe] = pTruth[lVar3 + -2];
          lVar3 = lVar3 + -1;
        } while (1 < lVar3);
      }
      Extra_TruthCofactor0(Extra_TruthMinCofSuppOverlap::uCofactor,nVars,iVar);
      uVar2 = Extra_TruthSupport(Extra_TruthMinCofSuppOverlap::uCofactor,nVars);
      lVar3 = (ulong)uVar1 + 1;
      if (0 < (int)uVar1) {
        do {
          Extra_TruthVarsAntiSymm::uTemp1[lVar3 + 0xe] = pTruth[lVar3 + -2];
          lVar3 = lVar3 + -1;
        } while (1 < lVar3);
      }
      uVar6 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555);
      uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
      uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
      uVar7 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
      Extra_TruthCofactor1(Extra_TruthMinCofSuppOverlap::uCofactor,nVars,iVar);
      uVar6 = Extra_TruthSupport(Extra_TruthMinCofSuppOverlap::uCofactor,nVars);
      uVar5 = (uVar6 >> 1 & 0x55555555) + (uVar6 & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
      uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
      uVar2 = ((uVar6 & uVar2) >> 1 & 0x55555555) + (uVar6 & uVar2 & 0x55555555);
      uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
      uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
      uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
      uVar2 = (uVar2 >> 0x10) + (uVar2 & 0xff);
      if (((uVar5 >> 0x10) + (uVar5 & 0xff) < 6 && (uVar7 >> 0x10) + (uVar7 & 0xffff) < 6) &&
          uVar2 < uVar8) {
        uVar8 = uVar2;
        iVar4 = iVar;
      }
      if (uVar8 == 0) {
        uVar8 = 0;
        break;
      }
      iVar = iVar + 1;
    } while (iVar != nVars);
  }
  if (pVarMin != (int *)0x0) {
    *pVarMin = iVar4;
  }
  return uVar8;
}

Assistant:

int Extra_TruthMinCofSuppOverlap( unsigned * pTruth, int nVars, int * pVarMin )
{
    static unsigned uCofactor[16];
    int i, ValueCur, ValueMin, VarMin;
    unsigned uSupp0, uSupp1;
    int nVars0, nVars1;
    assert( nVars <= 9 );
    ValueMin = 32;
    VarMin   = -1;
    for ( i = 0; i < nVars; i++ )
    {
        // get negative cofactor
        Extra_TruthCopy( uCofactor, pTruth, nVars );
        Extra_TruthCofactor0( uCofactor, nVars, i );
        uSupp0 = Extra_TruthSupport( uCofactor, nVars );
        nVars0 = Extra_WordCountOnes( uSupp0 );
//Extra_PrintBinary( stdout, &uSupp0, 8 ); printf( "\n" );
        // get positive cofactor
        Extra_TruthCopy( uCofactor, pTruth, nVars );
        Extra_TruthCofactor1( uCofactor, nVars, i );
        uSupp1 = Extra_TruthSupport( uCofactor, nVars );
        nVars1 = Extra_WordCountOnes( uSupp1 );
//Extra_PrintBinary( stdout, &uSupp1, 8 ); printf( "\n" );
        // get the number of common vars
        ValueCur = Extra_WordCountOnes( uSupp0 & uSupp1 );
        if ( ValueMin > ValueCur && nVars0 <= 5 && nVars1 <= 5 )
        {
            ValueMin = ValueCur;
            VarMin = i;
        }
        if ( ValueMin == 0 )
            break;
    }
    if ( pVarMin )
        *pVarMin = VarMin;
    return ValueMin;
}